

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineOutput::Run
          (BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineOutput *this)

{
  State *state;
  Builder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  Deps *pDVar6;
  DepsLog *this_01;
  StringPiece path;
  StringPiece path_00;
  string err;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithQueryDepsLogTest).super_BuildTest.super_StateTestWithBuiltinRules.
           state_;
  AssertParse(state,
              "rule cp_multi_gcc\n    command = echo \'out1: $in\\nout2: $in\' > in.d && for file in $out; do cp in1 $$file; done\n    deps = gcc\n    depfile = in.d\nbuild out1 out2: cp_multi_gcc in1 in2\n"
              ,(ManifestParserOptions)0x0);
  pTVar2 = g_current_test;
  if (iVar4 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"out1","");
  this_00 = &(this->super_BuildWithQueryDepsLogTest).super_BuildTest.builder_;
  pNVar5 = Builder::AddTarget(this_00,&local_90,&local_70);
  testing::Test::Check
            (pTVar2,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0x7ce,"builder_.AddTarget(\"out1\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_70);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,1999,"\"\" == err");
  if (bVar3) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"in.d","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"out1: in1 in2\nout2: in1 in2","");
    VirtualFileSystem::Create
              (&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.fs_,&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_00,&local_70);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x7d1,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    testing::Test::Check
              (pTVar2,iVar4 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x7d2,"\"\" == err");
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)*(pointer *)
                              ((long)&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.
                                      command_runner_.commands_ran_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                       (long)(this->super_BuildWithQueryDepsLogTest).super_BuildTest.command_runner_
                             .commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x7d3,"1u == command_runner_.commands_ran_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(this->super_BuildWithQueryDepsLogTest).super_BuildTest.
                                 command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7d4,
                 "\"echo \'out1: in1 in2\\\\nout2: in1 in2\' > in.d && for file in out1 out2; do cp in1 $file; done\" == command_runner_.commands_ran_[0]"
                );
      path.len_ = 4;
      path.str_ = "out1";
      pNVar5 = State::LookupNode(state,path);
      this_01 = &(this->super_BuildWithQueryDepsLogTest).log_;
      pDVar6 = DepsLog::GetDeps(this_01,pNVar5);
      testing::Test::Check
                (g_current_test,pDVar6->node_count == 2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7d8,"2 == out1_deps->node_count");
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare((char *)*pDVar6->nodes);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7d9,"\"in1\" == out1_deps->nodes[0]->path()");
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare((char *)pDVar6->nodes[1]);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7da,"\"in2\" == out1_deps->nodes[1]->path()");
      path_00.len_ = 4;
      path_00.str_ = "out2";
      pNVar5 = State::LookupNode(state,path_00);
      pDVar6 = DepsLog::GetDeps(this_01,pNVar5);
      testing::Test::Check
                (g_current_test,pDVar6->node_count == 2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7de,"2 == out2_deps->node_count");
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare((char *)*pDVar6->nodes);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7df,"\"in1\" == out2_deps->nodes[0]->path()");
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare((char *)pDVar6->nodes[1]);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7e0,"\"in2\" == out2_deps->nodes[1]->path()");
      goto LAB_00130808;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00130808:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildWithQueryDepsLogTest, TwoOutputsDepFileGCCMultiLineOutput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cp_multi_gcc\n"
"    command = echo 'out1: $in\\nout2: $in' > in.d && for file in $out; do cp in1 $$file; done\n"
"    deps = gcc\n"
"    depfile = in.d\n"
"build out1 out2: cp_multi_gcc in1 in2\n"));

  std::string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  fs_.Create("in.d", "out1: in1 in2\nout2: in1 in2");
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("echo 'out1: in1 in2\\nout2: in1 in2' > in.d && for file in out1 out2; do cp in1 $file; done", command_runner_.commands_ran_[0]);

  Node* out1_node = state_.LookupNode("out1");
  DepsLog::Deps* out1_deps = log_.GetDeps(out1_node);
  EXPECT_EQ(2, out1_deps->node_count);
  EXPECT_EQ("in1", out1_deps->nodes[0]->path());
  EXPECT_EQ("in2", out1_deps->nodes[1]->path());

  Node* out2_node = state_.LookupNode("out2");
  DepsLog::Deps* out2_deps = log_.GetDeps(out2_node);
  EXPECT_EQ(2, out2_deps->node_count);
  EXPECT_EQ("in1", out2_deps->nodes[0]->path());
  EXPECT_EQ("in2", out2_deps->nodes[1]->path());
}